

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON_Utils.c
# Opt level: O2

int apply_patch(cJSON *object,cJSON *patch,cJSON_bool case_sensitive)

{
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  int iVar4;
  uint uVar5;
  cJSON_bool cVar6;
  cJSON *pcVar7;
  cJSON *pcVar8;
  uchar *puVar9;
  char *pcVar10;
  cJSON *pcVar11;
  cJSON *pcVar12;
  size_t sVar13;
  uchar *string;
  long in_FS_OFFSET;
  size_t local_40;
  size_t index;
  
  index = *(size_t *)(in_FS_OFFSET + 0x28);
  pcVar7 = get_object_item(patch,"path",case_sensitive);
  iVar4 = cJSON_IsString(pcVar7);
  if (iVar4 == 0) {
    uVar5 = 2;
    goto LAB_0010179d;
  }
  pcVar8 = get_object_item(patch,"op",case_sensitive);
  iVar4 = cJSON_IsString(pcVar8);
  if (iVar4 == 0) {
LAB_00101795:
    uVar5 = 3;
    goto LAB_0010179d;
  }
  pcVar10 = pcVar8->valuestring;
  iVar4 = strcmp(pcVar10,"add");
  if (iVar4 == 0) {
    uVar5 = 1;
LAB_001017e1:
    bVar1 = false;
LAB_001017e5:
    bVar2 = false;
LAB_001017e7:
    puVar9 = (uchar *)pcVar7->valuestring;
    if (*puVar9 != '\0' || (uVar5 & 0xfffffffd) != 1) {
      if ((uVar5 & 0xfffffffe) != 4) {
        if ((uVar5 & 0xfffffffe) == 2) {
          bVar1 = false;
          goto LAB_0010189e;
        }
        goto LAB_001018c7;
      }
      pcVar8 = get_object_item(patch,"from",case_sensitive);
      if (pcVar8 == (cJSON *)0x0) {
        uVar5 = 4;
        goto LAB_0010179d;
      }
      if (bVar1) {
        pcVar8 = detach_path(object,(uchar *)pcVar8->valuestring,case_sensitive);
      }
      else {
        pcVar8 = get_item_from_pointer(object,pcVar8->valuestring,case_sensitive);
      }
      if (pcVar8 == (cJSON *)0x0) {
        uVar5 = 5;
        goto LAB_0010179d;
      }
      if ((bVar2) && (pcVar8 = (cJSON *)cJSON_Duplicate(pcVar8,1), pcVar8 == (cJSON *)0x0)) {
        uVar5 = 6;
        goto LAB_0010179d;
      }
LAB_001019e8:
      puVar9 = cJSONUtils_strdup((uchar *)pcVar7->valuestring);
      if ((puVar9 == (uchar *)0x0) ||
         (pcVar10 = strrchr((char *)puVar9,0x2f), pcVar10 == (char *)0x0)) {
        string = (uchar *)0x0;
      }
      else {
        *pcVar10 = '\0';
        string = (uchar *)(pcVar10 + 1);
      }
      pcVar7 = get_item_from_pointer(object,(char *)puVar9,case_sensitive);
      decode_pointer_inplace(string);
      uVar5 = 9;
      if (string == (uchar *)0x0 || pcVar7 == (cJSON *)0x0) {
LAB_00101ad4:
        cJSON_Delete(pcVar8);
      }
      else {
        iVar4 = cJSON_IsArray(pcVar7);
        if (iVar4 == 0) {
          iVar4 = cJSON_IsObject(pcVar7);
          if (iVar4 == 0) goto LAB_00101ad4;
          if (case_sensitive == 0) {
            cJSON_DeleteItemFromObject(pcVar7,string);
          }
          else {
            cJSON_DeleteItemFromObjectCaseSensitive();
          }
          cJSON_AddItemToObject(pcVar7,string,pcVar8);
        }
        else {
          if ((*string != '-') || (string[1] != '\0')) {
            local_40 = 0;
            cVar6 = decode_array_index_from_pointer(string,&local_40);
            if (cVar6 == 0) {
              uVar5 = 0xb;
            }
            else {
              pcVar11 = (cJSON *)&pcVar7->child;
              pcVar12 = pcVar11;
              sVar3 = local_40;
              do {
                sVar13 = sVar3;
                pcVar12 = pcVar12->next;
                if (pcVar12 == (cJSON *)0x0) break;
                sVar3 = sVar13 - 1;
              } while (sVar13 != 0);
              if (sVar13 == 0) {
                if (pcVar12 != (cJSON *)0x0) {
                  pcVar8->next = pcVar12;
                  pcVar8->prev = pcVar12->prev;
                  pcVar12->prev = pcVar8;
                  if (pcVar12 != *(cJSON **)pcVar11) {
                    pcVar11 = pcVar8->prev;
                  }
                  pcVar11->next = pcVar8;
                  goto LAB_00101b2e;
                }
                goto LAB_00101b0c;
              }
              uVar5 = 10;
            }
            goto LAB_00101ad4;
          }
LAB_00101b0c:
          cJSON_AddItemToArray(pcVar7,pcVar8);
        }
LAB_00101b2e:
        uVar5 = 0;
      }
      if (puVar9 != (uchar *)0x0) {
        cJSON_free(puVar9);
      }
      goto LAB_0010179d;
    }
    pcVar7 = get_object_item(patch,"value",case_sensitive);
    uVar5 = 7;
    if (pcVar7 == (cJSON *)0x0) goto LAB_0010179d;
    pcVar7 = (cJSON *)cJSON_Duplicate(pcVar7,1);
    if (pcVar7 != (cJSON *)0x0) {
      overwrite_item(object,*pcVar7);
      cJSON_free(pcVar7);
      uVar5 = 0;
      if (object->string != (char *)0x0) {
        cJSON_free();
        object->string = (char *)0x0;
      }
      goto LAB_0010179d;
    }
  }
  else {
    iVar4 = strcmp(pcVar10,"remove");
    if (iVar4 != 0) {
      iVar4 = strcmp(pcVar10,"replace");
      if (iVar4 == 0) {
        uVar5 = 3;
        goto LAB_001017e1;
      }
      iVar4 = strcmp(pcVar10,"move");
      if (iVar4 == 0) {
        uVar5 = 4;
        bVar1 = true;
        goto LAB_001017e5;
      }
      iVar4 = strcmp(pcVar10,"copy");
      if (iVar4 != 0) {
        iVar4 = strcmp(pcVar10,"test");
        if (iVar4 == 0) {
          pcVar7 = get_item_from_pointer(object,pcVar7->valuestring,case_sensitive);
          pcVar8 = get_object_item(patch,"value",case_sensitive);
          cVar6 = compare_json(pcVar7,pcVar8,case_sensitive);
          uVar5 = (uint)(cVar6 == 0);
          goto LAB_0010179d;
        }
        goto LAB_00101795;
      }
      uVar5 = 5;
      bVar2 = true;
      bVar1 = false;
      goto LAB_001017e7;
    }
    puVar9 = (uchar *)pcVar7->valuestring;
    if (*puVar9 == '\0') {
      overwrite_item(object,(cJSON)ZEXT1664(ZEXT816(0)));
      uVar5 = 0;
      goto LAB_0010179d;
    }
    bVar1 = true;
LAB_0010189e:
    pcVar8 = detach_path(object,puVar9,case_sensitive);
    if (pcVar8 == (cJSON *)0x0) {
      uVar5 = 0xd;
      goto LAB_0010179d;
    }
    cJSON_Delete(pcVar8);
    uVar5 = 0;
    if (bVar1) goto LAB_0010179d;
LAB_001018c7:
    pcVar8 = get_object_item(patch,"value",case_sensitive);
    uVar5 = 7;
    if (pcVar8 == (cJSON *)0x0) goto LAB_0010179d;
    pcVar8 = (cJSON *)cJSON_Duplicate(pcVar8,1);
    if (pcVar8 != (cJSON *)0x0) goto LAB_001019e8;
  }
  uVar5 = 8;
LAB_0010179d:
  if (*(size_t *)(in_FS_OFFSET + 0x28) != index) {
    __stack_chk_fail();
  }
  return uVar5;
}

Assistant:

static int apply_patch(cJSON *object, const cJSON *patch, const cJSON_bool case_sensitive)
{
    cJSON *path = NULL;
    cJSON *value = NULL;
    cJSON *parent = NULL;
    enum patch_operation opcode = INVALID;
    unsigned char *parent_pointer = NULL;
    unsigned char *child_pointer = NULL;
    int status = 0;

    path = get_object_item(patch, "path", case_sensitive);
    if (!cJSON_IsString(path))
    {
        /* malformed patch. */
        status = 2;
        goto cleanup;
    }

    opcode = decode_patch_operation(patch, case_sensitive);
    if (opcode == INVALID)
    {
        status = 3;
        goto cleanup;
    }
    else if (opcode == TEST)
    {
        /* compare value: {...} with the given path */
        status = !compare_json(get_item_from_pointer(object, path->valuestring, case_sensitive), get_object_item(patch, "value", case_sensitive), case_sensitive);
        goto cleanup;
    }

    /* special case for replacing the root */
    if (path->valuestring[0] == '\0')
    {
        if (opcode == REMOVE)
        {
            static const cJSON invalid = { NULL, NULL, NULL, cJSON_Invalid, NULL, 0, 0, NULL};

            overwrite_item(object, invalid);

            status = 0;
            goto cleanup;
        }

        if ((opcode == REPLACE) || (opcode == ADD))
        {
            value = get_object_item(patch, "value", case_sensitive);
            if (value == NULL)
            {
                /* missing "value" for add/replace. */
                status = 7;
                goto cleanup;
            }

            value = cJSON_Duplicate(value, 1);
            if (value == NULL)
            {
                /* out of memory for add/replace. */
                status = 8;
                goto cleanup;
            }

            overwrite_item(object, *value);

            /* delete the duplicated value */
            cJSON_free(value);
            value = NULL;

            /* the string "value" isn't needed */
            if (object->string != NULL)
            {
                cJSON_free(object->string);
                object->string = NULL;
            }

            status = 0;
            goto cleanup;
        }
    }

    if ((opcode == REMOVE) || (opcode == REPLACE))
    {
        /* Get rid of old. */
        cJSON *old_item = detach_path(object, (unsigned char*)path->valuestring, case_sensitive);
        if (old_item == NULL)
        {
            status = 13;
            goto cleanup;
        }
        cJSON_Delete(old_item);
        if (opcode == REMOVE)
        {
            /* For Remove, this job is done. */
            status = 0;
            goto cleanup;
        }
    }

    /* Copy/Move uses "from". */
    if ((opcode == MOVE) || (opcode == COPY))
    {
        cJSON *from = get_object_item(patch, "from", case_sensitive);
        if (from == NULL)
        {
            /* missing "from" for copy/move. */
            status = 4;
            goto cleanup;
        }

        if (opcode == MOVE)
        {
            value = detach_path(object, (unsigned char*)from->valuestring, case_sensitive);
        }
        if (opcode == COPY)
        {
            value = get_item_from_pointer(object, from->valuestring, case_sensitive);
        }
        if (value == NULL)
        {
            /* missing "from" for copy/move. */
            status = 5;
            goto cleanup;
        }
        if (opcode == COPY)
        {
            value = cJSON_Duplicate(value, 1);
        }
        if (value == NULL)
        {
            /* out of memory for copy/move. */
            status = 6;
            goto cleanup;
        }
    }
    else /* Add/Replace uses "value". */
    {
        value = get_object_item(patch, "value", case_sensitive);
        if (value == NULL)
        {
            /* missing "value" for add/replace. */
            status = 7;
            goto cleanup;
        }
        value = cJSON_Duplicate(value, 1);
        if (value == NULL)
        {
            /* out of memory for add/replace. */
            status = 8;
            goto cleanup;
        }
    }

    /* Now, just add "value" to "path". */

    /* split pointer in parent and child */
    parent_pointer = cJSONUtils_strdup((unsigned char*)path->valuestring);
    if (parent_pointer) {
        child_pointer = (unsigned char*)strrchr((char*)parent_pointer, '/');
    }
    if (child_pointer != NULL)
    {
        child_pointer[0] = '\0';
        child_pointer++;
    }
    parent = get_item_from_pointer(object, (char*)parent_pointer, case_sensitive);
    decode_pointer_inplace(child_pointer);

    /* add, remove, replace, move, copy, test. */
    if ((parent == NULL) || (child_pointer == NULL))
    {
        /* Couldn't find object to add to. */
        status = 9;
        goto cleanup;
    }
    else if (cJSON_IsArray(parent))
    {
        if (strcmp((char*)child_pointer, "-") == 0)
        {
            cJSON_AddItemToArray(parent, value);
            value = NULL;
        }
        else
        {
            size_t index = 0;
            if (!decode_array_index_from_pointer(child_pointer, &index))
            {
                status = 11;
                goto cleanup;
            }

            if (!insert_item_in_array(parent, index, value))
            {
                status = 10;
                goto cleanup;
            }
            value = NULL;
        }
    }
    else if (cJSON_IsObject(parent))
    {
        if (case_sensitive)
        {
            cJSON_DeleteItemFromObjectCaseSensitive(parent, (char*)child_pointer);
        }
        else
        {
            cJSON_DeleteItemFromObject(parent, (char*)child_pointer);
        }
        cJSON_AddItemToObject(parent, (char*)child_pointer, value);
        value = NULL;
    }
    else /* parent is not an object */
    {
        /* Couldn't find object to add to. */
        status = 9;
        goto cleanup;
    }

cleanup:
    if (value != NULL)
    {
        cJSON_Delete(value);
    }
    if (parent_pointer != NULL)
    {
        cJSON_free(parent_pointer);
    }

    return status;
}